

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
regex_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(regex_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,const_reference val,error_code *param_2)

{
  bool bVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_2)
  ;
  if (bVar1) {
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    as_string<std::allocator<wchar_t>>
              (&local_40,(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)param_2
              );
    bVar1 = std::
            regex_search<std::char_traits<wchar_t>,std::allocator<wchar_t>,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                      (&local_40,
                       (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                       ((long)&val[1].field_0 + 8),0);
    *(undefined2 *)
     &(this->
      super_unary_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      )._vptr_unary_operator = 1;
    *(bool *)((long)&(this->
                     super_unary_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     )._vptr_unary_operator + 2) = bVar1;
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
    uVar2 = extraout_RDX;
  }
  else {
    other = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
    uVar2 = extraout_RDX_00;
  }
  bVar3.field_0.int64_.val_ = uVar2;
  bVar3.field_0._0_8_ = this;
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar3.field_0;
}

Assistant:

Json evaluate(const_reference val, std::error_code&) const override
        {
            if (!val.is_string())
            {
                return Json::null();
            }
            return std::regex_search(val.as_string(), pattern_) ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
        }